

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::FieldOptions::MergePartialFromCodedStream
          (FieldOptions *this,CodedInputStream *input)

{
  InternalMetadataWithArena *this_00;
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  void *pvVar4;
  uint8 *puVar5;
  uint uVar6;
  bool bVar7;
  int byte_limit;
  uint32 uVar8;
  Type *this_01;
  unsigned_long uVar9;
  pair<int,_int> pVar10;
  int64 iVar11;
  UnknownFieldSet *pUVar12;
  char cVar13;
  uint uVar14;
  ulong uVar15;
  pair<unsigned_long,_bool> pVar16;
  
  this_00 = &this->_internal_metadata_;
LAB_001fd877:
  pbVar3 = input->buffer_;
  uVar8 = 0;
  if (pbVar3 < input->buffer_end_) {
    bVar2 = *pbVar3;
    uVar8 = (uint32)bVar2;
    pbVar1 = pbVar3 + 1;
    uVar14 = (uint)bVar2;
    if ((char)bVar2 < '\x01') {
      if ((input->buffer_end_ <= pbVar1) || ((~(uint)*pbVar1 & uVar14) < 0x80)) goto LAB_001fdbb7;
      uVar14 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
      input->buffer_ = pbVar3 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar15 = (ulong)uVar14 | 0x100000000;
  }
  else {
LAB_001fdbb7:
    uVar8 = io::CodedInputStream::ReadTagFallback(input,uVar8);
    uVar15 = 0;
    if (uVar8 - 1 < 0x3fff) {
      uVar15 = 0x100000000;
    }
    uVar15 = uVar8 | uVar15;
  }
  uVar14 = (uint)uVar15;
  if ((uVar15 & 0x100000000) == 0) goto switchD_001fd941_caseD_4;
  uVar6 = (uint)(uVar15 >> 3) & 0x1fffffff;
  cVar13 = (char)uVar15;
  switch(uVar6) {
  case 1:
    if (cVar13 == '\b') {
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar2 = *pbVar3;
        uVar8 = (uint32)bVar2;
        uVar14 = (uint)bVar2;
        if ((char)bVar2 < '\0') goto LAB_001fdbff;
        input->buffer_ = pbVar3 + 1;
      }
      else {
        uVar8 = 0;
LAB_001fdbff:
        iVar11 = io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
        uVar14 = (uint)iVar11;
        if (iVar11 < 0) {
          return false;
        }
      }
      if (uVar14 < 3) {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        this->ctype_ = uVar14;
      }
      else {
        pvVar4 = (this_00->
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 ).ptr_;
        if (((ulong)pvVar4 & 1) == 0) {
          pUVar12 = internal::
                    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                    ::mutable_unknown_fields_slow
                              (&this_00->
                                super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                              );
        }
        else {
          pUVar12 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
        }
        UnknownFieldSet::AddVarint(pUVar12,1,(long)(int)uVar14);
      }
      goto LAB_001fd877;
    }
    break;
  case 2:
    if (cVar13 == '\x10') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar9 = (unsigned_long)(char)*puVar5, -1 < (long)uVar9))
      {
        input->buffer_ = puVar5 + 1;
      }
      else {
        pVar16 = io::CodedInputStream::ReadVarint64Fallback(input);
        uVar9 = pVar16.first;
        if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->packed_ = uVar9 != 0;
      goto LAB_001fd877;
    }
    break;
  case 3:
    if (cVar13 == '\x18') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar9 = (unsigned_long)(char)*puVar5, -1 < (long)uVar9))
      {
        input->buffer_ = puVar5 + 1;
      }
      else {
        pVar16 = io::CodedInputStream::ReadVarint64Fallback(input);
        uVar9 = pVar16.first;
        if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->deprecated_ = uVar9 != 0;
      goto LAB_001fd877;
    }
    break;
  case 4:
  case 7:
  case 8:
  case 9:
    break;
  case 5:
    if (cVar13 == '(') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar9 = (unsigned_long)(char)*puVar5, -1 < (long)uVar9))
      {
        input->buffer_ = puVar5 + 1;
      }
      else {
        pVar16 = io::CodedInputStream::ReadVarint64Fallback(input);
        uVar9 = pVar16.first;
        if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->lazy_ = uVar9 != 0;
      goto LAB_001fd877;
    }
    break;
  case 6:
    if (cVar13 == '0') {
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar2 = *pbVar3;
        uVar8 = (uint32)bVar2;
        uVar14 = (uint)bVar2;
        if ((char)bVar2 < '\0') goto LAB_001fdc4a;
        input->buffer_ = pbVar3 + 1;
      }
      else {
        uVar8 = 0;
LAB_001fdc4a:
        iVar11 = io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
        uVar14 = (uint)iVar11;
        if (iVar11 < 0) {
          return false;
        }
      }
      if (uVar14 < 3) {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
        this->jstype_ = uVar14;
      }
      else {
        pvVar4 = (this_00->
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 ).ptr_;
        if (((ulong)pvVar4 & 1) == 0) {
          pUVar12 = internal::
                    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                    ::mutable_unknown_fields_slow
                              (&this_00->
                                super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                              );
        }
        else {
          pUVar12 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
        }
        UnknownFieldSet::AddVarint(pUVar12,6,(long)(int)uVar14);
      }
      goto LAB_001fd877;
    }
    break;
  case 10:
    if (cVar13 == 'P') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar9 = (unsigned_long)(char)*puVar5, -1 < (long)uVar9))
      {
        input->buffer_ = puVar5 + 1;
      }
      else {
        pVar16 = io::CodedInputStream::ReadVarint64Fallback(input);
        uVar9 = pVar16.first;
        if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->weak_ = uVar9 != 0;
      goto LAB_001fd877;
    }
    break;
  default:
    if ((uVar6 != 999) || (cVar13 != ':')) break;
    this_01 = internal::RepeatedPtrFieldBase::
              Add<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                        (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,(Type *)0x0);
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) && (byte_limit = (int)(char)*puVar5, -1 < byte_limit)) {
      input->buffer_ = puVar5 + 1;
    }
    else {
      byte_limit = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
      if (byte_limit < 0) {
        return false;
      }
    }
    pVar10 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,byte_limit);
    if ((long)pVar10 < 0) {
      return false;
    }
    bVar7 = UninterpretedOption::MergePartialFromCodedStream(this_01,input);
    if (!bVar7) {
      return false;
    }
    bVar7 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar10.first);
    if (!bVar7) {
      return false;
    }
    goto LAB_001fd877;
  }
switchD_001fd941_caseD_4:
  if (uVar14 == 0) {
    return true;
  }
  if ((uVar14 & 7) == 4) {
    return true;
  }
  pvVar4 = (this_00->
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ).ptr_;
  if (uVar14 < 8000) {
    if (((ulong)pvVar4 & 1) == 0) {
      pUVar12 = internal::
                InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                ::mutable_unknown_fields_slow
                          (&this_00->
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          );
    }
    else {
      pUVar12 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
    }
    bVar7 = internal::WireFormat::SkipField(input,uVar14,pUVar12);
  }
  else {
    if (((ulong)pvVar4 & 1) == 0) {
      pUVar12 = internal::
                InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                ::mutable_unknown_fields_slow
                          (&this_00->
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          );
    }
    else {
      pUVar12 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
    }
    bVar7 = internal::ExtensionSet::ParseField
                      (&this->_extensions_,uVar14,input,(Message *)&_FieldOptions_default_instance_,
                       pUVar12);
  }
  if (bVar7 == false) {
    return false;
  }
  goto LAB_001fd877;
}

Assistant:

bool FieldOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.FieldOptions)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldOptions_CType_IsValid(value)) {
            set_ctype(static_cast< ::google::protobuf::FieldOptions_CType >(value));
          } else {
            mutable_unknown_fields()->AddVarint(1, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool packed = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_packed();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &packed_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool deprecated = 3 [default = false];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_deprecated();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &deprecated_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool lazy = 5 [default = false];
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_lazy();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &lazy_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.FieldOptions.JSType jstype = 6 [default = JS_NORMAL];
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldOptions_JSType_IsValid(value)) {
            set_jstype(static_cast< ::google::protobuf::FieldOptions_JSType >(value));
          } else {
            mutable_unknown_fields()->AddVarint(6, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool weak = 10 [default = false];
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          set_has_weak();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &weak_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(7994u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, internal_default_instance(),
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.FieldOptions)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.FieldOptions)
  return false;
#undef DO_
}